

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_healthy_m(REF_DBL *m)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL floor;
  REF_DBL system [12];
  REF_DBL *m_local;
  
  system[0xb] = (REF_DBL)m;
  m_local._4_4_ = ref_matrix_diag_m(m,&floor);
  if (m_local._4_4_ == 0) {
    if (((floor < -1e-15) || (system[0] < -1e-15)) || (system[1] < -1e-15)) {
      printf("eigs %e %e %e\n",floor,system[0],system[1]);
      m_local._4_4_ = ref_matrix_show_m((REF_DBL *)system[0xb]);
      if (m_local._4_4_ == 0) {
        m_local._4_4_ = 1;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",
               0x305,"ref_matrix_healthy_m",(ulong)m_local._4_4_,"show");
      }
    }
    else {
      m_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x300,
           "ref_matrix_healthy_m",(ulong)m_local._4_4_,"diag");
  }
  return m_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_healthy_m(REF_DBL *m) {
  REF_DBL system[12];
  REF_DBL floor = -1.0e-15;
  RSS(ref_matrix_diag_m(m, system), "diag");
  if (ref_matrix_eig(system, 0) < floor || ref_matrix_eig(system, 1) < floor ||
      ref_matrix_eig(system, 2) < floor) {
    printf("eigs %e %e %e\n", ref_matrix_eig(system, 0),
           ref_matrix_eig(system, 1), ref_matrix_eig(system, 2));
    RSS(ref_matrix_show_m(m), "show");
    return REF_FAILURE;
  }

  return REF_SUCCESS;
}